

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_peread.c
# Opt level: O0

int pe_section_name_get(dwarf_pe_object_access_internals_t *pep,char *name_array,
                       unsigned_long size_name,char **name_out,int *errcode)

{
  int iVar1;
  ulong startindex;
  char local_59;
  int res;
  char temp_array [9];
  char *s;
  unsigned_long u;
  long v;
  int *errcode_local;
  char **name_out_local;
  unsigned_long size_name_local;
  char *name_array_local;
  dwarf_pe_object_access_internals_t *pep_local;
  
  if (*name_array == '/') {
    temp_array[1] = '\0';
    temp_array[2] = '\0';
    temp_array[3] = '\0';
    temp_array[4] = '\0';
    temp_array[5] = '\0';
    temp_array[6] = '\0';
    temp_array[7] = '\0';
    temp_array[8] = '\0';
    _dwarf_safe_strcpy(&local_59,9,name_array + 1,size_name - 1);
    iVar1 = atoi(&local_59);
    startindex = (ulong)iVar1;
    if ((long)startindex < 0) {
      *errcode = 0x35;
      pep_local._4_4_ = 1;
    }
    else if (pep->pe_string_table == (char *)0x0) {
      *errcode = 0x35;
      pep_local._4_4_ = 1;
    }
    else if (startindex < pep->pe_string_table_size) {
      iVar1 = check_valid_string(pep->pe_string_table,pep->pe_string_table_size,startindex);
      if (iVar1 == 0) {
        *name_out = pep->pe_string_table + startindex;
        pep_local._4_4_ = 0;
      }
      else {
        *errcode = 0x35;
        pep_local._4_4_ = 1;
      }
    }
    else {
      *errcode = 0x35;
      pep_local._4_4_ = 1;
    }
  }
  else {
    *name_out = name_array;
    pep_local._4_4_ = 0;
  }
  return pep_local._4_4_;
}

Assistant:

static int
pe_section_name_get(dwarf_pe_object_access_internals_t *pep,
    const char *name_array,

    /* The name strlen */
    unsigned long size_name,
    const char ** name_out,
    int *errcode)
{
    if (name_array[0] == '/') {
        long v = 0;
        unsigned long u = 0;
        const char *s = 0;
        char temp_array[9];
        int res = 0;

        /*  The value is an integer after the /,
            and we want the value */
        _dwarf_safe_strcpy(temp_array,sizeof(temp_array),
            name_array+1,size_name-1);
        v = atoi(temp_array);
        if (v < 0) {
            *errcode = DW_DLE_STRING_OFFSET_BAD;
            return DW_DLV_ERROR;
        }
        u = v;
        if (!pep->pe_string_table) {
            *errcode = DW_DLE_STRING_OFFSET_BAD;
            return DW_DLV_ERROR;
        }
        if (u >= pep->pe_string_table_size) {
            *errcode = DW_DLE_STRING_OFFSET_BAD;
            return DW_DLV_ERROR;
        }
        res = check_valid_string(pep->pe_string_table,
            pep->pe_string_table_size,u);
        if (res != DW_DLV_OK) {
            *errcode = DW_DLE_STRING_OFFSET_BAD;
            return DW_DLV_ERROR;
        }
        s = pep->pe_string_table +u;
        *name_out = s;
        return DW_DLV_OK;
    }
    *name_out = name_array;
    return DW_DLV_OK;
}